

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void predict_or_learn_adf<true,true>(cbify *data,multi_learner *base,example *ec)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  reference ppeVar4;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *this;
  undefined8 uVar5;
  action_score *paVar6;
  long in_RDX;
  long in_RDI;
  label *lab;
  stringstream __msg_1;
  cb_class cl;
  stringstream __msg;
  uint32_t chosen_action;
  example *out_ec;
  label csl;
  label_t ld;
  cb_class *in_stack_fffffffffffffbe8;
  v_array<CB::cb_class> *in_stack_fffffffffffffbf0;
  action_scores *in_stack_fffffffffffffbf8;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc08;
  uint32_t in_stack_fffffffffffffc14;
  v_array<COST_SENSITIVE::wclass> *in_stack_fffffffffffffc18;
  cbify *in_stack_fffffffffffffc20;
  score_iterator *in_stack_fffffffffffffc28;
  uint64_t in_stack_fffffffffffffc30;
  stringstream local_3c8 [16];
  stringstream local_3b8 [32];
  example *in_stack_fffffffffffffc68;
  cbify *in_stack_fffffffffffffc70;
  stringstream local_1f8 [16];
  ostream local_1e8;
  uint local_4c;
  value_type local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_18;
  long local_8;
  
  local_40 = *(undefined8 *)(in_RDX + 0x6828);
  local_38 = *(undefined8 *)(in_RDX + 0x6830);
  local_30 = *(undefined8 *)(in_RDX + 0x6838);
  local_28 = *(undefined8 *)(in_RDX + 0x6840);
  local_18 = in_RDX;
  local_8 = in_RDI;
  copy_example_to_adf(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
            (in_stack_fffffffffffffc00,
             (vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffbf8,
             (size_t)in_stack_fffffffffffffbf0);
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      ((vector<example_*,_std::allocator<example_*>_> *)(local_8 + 0x60),0);
  local_48 = *ppeVar4;
  lVar2 = *(long *)(local_8 + 0x48);
  *(long *)(local_8 + 0x48) = lVar2 + 1;
  this = (learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
         (*(long *)(local_8 + 0x20) + lVar2);
  ACTION_SCORE::begin_scores(in_stack_fffffffffffffbf8);
  ACTION_SCORE::end_scores(in_stack_fffffffffffffbf8);
  iVar3 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
                     (score_iterator *)in_stack_fffffffffffffc20,
                     (uint32_t *)in_stack_fffffffffffffc18);
  if (iVar3 != 0) {
    std::__cxx11::stringstream::stringstream(local_1f8);
    std::operator<<(&local_1e8,"Failed to sample from pdf");
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,
               in_stack_fffffffffffffc14,in_stack_fffffffffffffc08);
    __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  paVar6 = v_array<ACTION_SCORE::action_score>::operator[]
                     ((v_array<ACTION_SCORE::action_score> *)&(local_48->pred).scalars,
                      (ulong)local_4c);
  uVar1 = paVar6->action;
  iVar3 = uVar1 + 1;
  v_array<ACTION_SCORE::action_score>::operator[]
            ((v_array<ACTION_SCORE::action_score> *)&(local_48->pred).scalars,(ulong)local_4c);
  if (iVar3 == 0) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    std::operator<<((ostream *)(local_3c8 + 0x10),"No action with non-zero probability found!");
    iVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffc14);
    uVar5 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18,iVar3,
               in_stack_fffffffffffffc08);
    __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  loss_cs(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc14);
  std::vector<example_*,_std::allocator<example_*>_>::operator[]
            ((vector<example_*,_std::allocator<example_*>_> *)(local_8 + 0x60),(ulong)uVar1);
  v_array<CB::cb_class>::clear(in_stack_fffffffffffffbf0);
  v_array<CB::cb_class>::push_back(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
            (this,(vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffbf8,
             (size_t)in_stack_fffffffffffffbf0);
  *(int *)(local_18 + 0x6850) = iVar3;
  return;
}

Assistant:

void predict_or_learn_adf(cbify& data, multi_learner& base, example& ec)
{
  // Store the multiclass or cost-sensitive input label
  MULTICLASS::label_t ld;
  COST_SENSITIVE::label csl;
  if (use_cs)
    csl = ec.l.cs;
  else
    ld = ec.l.multi;

  copy_example_to_adf(data, ec);
  base.predict(data.adf_data.ecs);

  auto& out_ec = *data.adf_data.ecs[0];

  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s),
          end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

  CB::cb_class cl;
  cl.action = out_ec.pred.a_s[chosen_action].action + 1;
  cl.probability = out_ec.pred.a_s[chosen_action].score;

  if (!cl.action)
    THROW("No action with non-zero probability found!");

  if (use_cs)
    cl.cost = loss_cs(data, csl.costs, cl.action);
  else
    cl.cost = loss(data, ld.label, cl.action);

  // add cb label to chosen action
  auto& lab = data.adf_data.ecs[cl.action - 1]->l.cb;
  lab.costs.clear();
  lab.costs.push_back(cl);

  if (is_learn)
    base.learn(data.adf_data.ecs);

  ec.pred.multiclass = cl.action;
}